

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

int __thiscall Logger::init(Logger *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  thread *this_01;
  FILE *pFVar2;
  invalid_argument *this_02;
  log_level in_ECX;
  undefined8 uVar3;
  int in_EDX;
  int iVar4;
  undefined7 uVar5;
  uint uVar6;
  char *pcVar7;
  char *__format;
  int in_R8D;
  int in_R9D;
  my_time mVar8;
  char log_file_fullname [268];
  
  if (this->l_inited == true) {
    if (pr_level < 1) {
      return 0;
    }
    __format = "[%-5s][%s:%d] Logger has been initialized, do not try again!\n";
    pcVar7 = "warn";
    iVar4 = 0;
    uVar3 = 0x50;
  }
  else {
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      this->l_is_stdout = true;
    }
    if ((this->l_is_stdout == false) && (sVar1 = strlen((char *)ctx), 0x7f < sVar1)) {
      if (-1 < pr_level) {
        printf("[%-5s][%s:%d] file name must be less than 128 bytes!\n","error","init",0x5b);
      }
      this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_02,"file name must be less than 128 bytes!");
      __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if (LOG_LEVEL_DEBUG < in_ECX) {
      __assert_fail("level>=Logger::LOG_LEVEL_ERROR && level<=Logger::LOG_LEVEL_DEBUG",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/log.h"
                    ,0x6c,"static Logger::log_level Logger::set_log_level(Logger::log_level)");
    }
    g_log_level = in_ECX;
    if (0 < in_EDX) {
      this->l_is_async = true;
      this_00 = (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x88);
      buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::buffer_queue(this_00,in_EDX,false);
      this->l_buffer_queue = this_00;
      this_01 = (thread *)operator_new(8);
      log_file_fullname._0_8_ = async_flush;
      std::thread::thread<void(*)(),,void>(this_01,(_func_void **)log_file_fullname);
      this->l_asyncw_thread = this_01;
    }
    this->l_buf_size = in_R8D;
    pcVar7 = (char *)operator_new__((long)in_R8D);
    this->l_buf = pcVar7;
    memset(pcVar7,0,(long)in_R8D);
    this->l_split_lines = in_R9D;
    mVar8 = get_current_sys_time();
    uVar6 = mVar8._2_4_ >> 0x18;
    this->l_today = uVar6;
    uVar5 = (undefined7)((ulong)this >> 8);
    if (this->l_is_stdout == true) {
      this->l_inited = true;
      this->l_fp = _stdout;
      if (2 < pr_level) {
        printf("[%-5s][%s:%d] succeed in using stdout as log output\n","debug","init",0x75);
      }
      iVar4 = (int)CONCAT71(uVar5,1);
      if (pr_level < 3) {
        return iVar4;
      }
      __format = "[%-5s][%s:%d] log init finished!\n";
      pcVar7 = "debug";
      uVar3 = 0x76;
    }
    else {
      pcVar7 = strrchr((char *)ctx,0x2f);
      memset(log_file_fullname,0,0x10c);
      if (pcVar7 == (char *)0x0) {
        if (pr_level < 0) {
          return 0;
        }
        __format = "[%-5s][%s:%d] log file name should behind \'/\'\n";
        pcVar7 = "error";
        iVar4 = 0;
        uVar3 = 0x7f;
      }
      else {
        strcpy(this->l_file_name,pcVar7 + 1);
        strncpy(this->l_dir_name,(char *)ctx,(size_t)(pcVar7 + (1 - (long)ctx)));
        snprintf(log_file_fullname,0x10b,"%s%04d_%02d_%02d_%s",this,mVar8._0_8_ & 0xffffffff,
                 (ulong)(uint)(mVar8._1_4_ >> 0x18),(ulong)uVar6,this->l_file_name);
        pFVar2 = fopen(log_file_fullname,"a");
        this->l_fp = (FILE *)pFVar2;
        if (pFVar2 == (FILE *)0x0) {
          if (pr_level < 0) {
            return 0;
          }
          printf("[%-5s][%s:%d] open %s failed!\n","error","init",0x8e,log_file_fullname);
          return 0;
        }
        this->l_inited = true;
        if (2 < pr_level) {
          printf("[%-5s][%s:%d] succeed in using file %s as log output\n","debug","init",0x93,
                 log_file_fullname);
        }
        iVar4 = (int)CONCAT71(uVar5,1);
        if (pr_level < 3) {
          return iVar4;
        }
        __format = "[%-5s][%s:%d] log init finished!\n";
        pcVar7 = "debug";
        uVar3 = 0x94;
      }
    }
  }
  printf(__format,pcVar7,"init",uVar3);
  return iVar4;
}

Assistant:

bool Logger::init(const char *file_name, int buffer_queue_size, 
                    Logger::log_level level, int buffer_size, int split_lines)
{
    if(l_inited)
    {
        PR_WARN("Logger has been initialized, do not try again!\n");
        return false;
    }

    if(!file_name)
    {
        l_is_stdout = true;
    }

    if( !l_is_stdout && strlen(file_name)>=128 )
    {
        PR_ERROR("file name must be less than 128 bytes!\n");
        // exit(-1);
        throw invalid_argument("file name must be less than 128 bytes!");;
    }

    set_log_level(level);

    if (buffer_queue_size >= 1)
    {
        l_is_async = true;
        l_buffer_queue = new buffer_queue<string>(buffer_queue_size);
        l_asyncw_thread = new thread(&Logger::async_flush);
    }
    
    l_buf_size = buffer_size;
    l_buf = new char[l_buf_size];
    memset(l_buf, '\0', l_buf_size);
    l_split_lines = split_lines;

    my_time tm = get_current_sys_time();
    l_today = tm.day;
 
    if(l_is_stdout)
    {
        l_inited = true;
        l_fp = stdout;
        PR_DEBUG("succeed in using stdout as log output\n");
        PR_DEBUG("log init finished!\n");
        return true;
    }

    const char *p = strrchr(file_name, '/');
    char log_file_fullname[268] = {0};

    if (p == NULL)
    {
        PR_ERROR("log file name should behind '/'\n");
        return false;
    }
    else
    {
        strcpy(l_file_name, p + 1);
        strncpy(l_dir_name, file_name, p - file_name + 1);
        snprintf(log_file_fullname, 267, "%s%04d_%02d_%02d_%s", l_dir_name, 
            tm.year, tm.month, tm.day, l_file_name);
    
        l_fp = fopen(log_file_fullname, "a");
    }

    if (l_fp == NULL)
    {
        PR_ERROR("open %s failed!\n", log_file_fullname);
        return false;
    }

    l_inited = true;
    PR_DEBUG("succeed in using file %s as log output\n", log_file_fullname);
    PR_DEBUG("log init finished!\n");

    return true;
}